

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::clear(QMenu *this)

{
  pointer ppQVar1;
  int i;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions((QList<QAction_*> *)&local_38,&this->super_QWidget);
  for (puVar2 = (undefined1 *)0x0; puVar2 < (ulong)local_38.size; puVar2 = puVar2 + 1) {
    ppQVar1 = QList<QAction_*>::data((QList<QAction_*> *)&local_38);
    QWidget::removeAction(&this->super_QWidget,ppQVar1[(long)puVar2]);
    ppQVar1 = QList<QAction_*>::data((QList<QAction_*> *)&local_38);
    if (*(QMenu **)(*(long *)(ppQVar1[(long)puVar2] + 8) + 0x10) == this) {
      ppQVar1 = QList<QAction_*>::data((QList<QAction_*> *)&local_38);
      if (*(long *)(*(long *)(ppQVar1[(long)puVar2] + 8) + 0x150) == 0) {
        ppQVar1 = QList<QAction_*>::data((QList<QAction_*> *)&local_38);
        if (ppQVar1[(long)puVar2] != (QAction *)0x0) {
          (**(code **)(*(long *)ppQVar1[(long)puVar2] + 0x20))();
        }
      }
    }
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::clear()
{
    QList<QAction*> acts = actions();

    for(int i = 0; i < acts.size(); i++) {
        removeAction(acts[i]);
        if (acts[i]->parent() == this && acts[i]->d_func()->associatedObjects.isEmpty())
            delete acts[i];
    }
}